

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

double filter_bessel(double x)

{
  long i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double local_48;
  double dStack_40;
  
  dVar2 = 0.0;
  if ((x == 0.0) && (!NAN(x))) {
    return 0.7853981633974483;
  }
  dVar12 = x * 3.141592653589793;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar2 = -dVar12;
    if (-dVar12 <= dVar12) {
      dVar2 = dVar12;
    }
    if (8.0 <= dVar2) {
      dVar3 = 2.0 / (dVar2 * 3.141592653589793);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar13 = 8.0 / dVar2;
      dVar6 = 1.2571716929145342;
      dVar8 = 1.0;
      for (lVar1 = 4; -1 < lVar1; lVar1 = lVar1 + -1) {
        dVar6 = dVar6 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Pone + lVar1 * 8);
        dVar8 = dVar8 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Qone + lVar1 * 8);
      }
      dVar4 = sin(dVar2);
      dVar5 = cos(dVar2);
      dVar7 = 0.03532840052740124;
      dVar9 = 1.0;
      for (lVar1 = 4; -1 < lVar1; lVar1 = lVar1 + -1) {
        dVar7 = dVar7 * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Pone + lVar1 * 8);
        dVar9 = dVar9 * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Qone + lVar1 * 8);
      }
      auVar10._8_8_ = dVar7;
      auVar10._0_8_ = 0xc020000000000000;
      auVar11._8_8_ = dVar9;
      auVar11._0_8_ = dVar2;
      auVar11 = divpd(auVar10,auVar11);
      dVar13 = sin(dVar2);
      dVar2 = cos(dVar2);
      local_48 = auVar11._0_8_;
      dStack_40 = auVar11._8_8_;
      dVar3 = dVar3 * (dStack_40 * local_48 * (dVar2 + dVar13) * -0.7071067811865475 +
                      (dVar4 - dVar5) * 0.7071067811865475 * (dVar6 / dVar8));
      dVar2 = (double)(-(ulong)(dVar12 < 0.0) & (ulong)-dVar3 |
                      ~-(ulong)(dVar12 < 0.0) & (ulong)dVar3);
    }
    else {
      dVar3 = 2701.1227108923235;
      dVar6 = 1.0;
      for (lVar1 = 7; -1 < lVar1; lVar1 = lVar1 + -1) {
        dVar3 = dVar3 * dVar2 * dVar2 + *(double *)(KernelBessel_J1_Pone + lVar1 * 8);
        dVar6 = dVar6 * dVar2 * dVar2 + *(double *)(KernelBessel_J1_Qone + lVar1 * 8);
      }
      dVar2 = dVar12 * (dVar3 / dVar6);
    }
  }
  return dVar2 / (x + x);
}

Assistant:

static double filter_bessel(const double x)
{
	if (x == 0.0f)
		return (double)(M_PI/4.0f);
	return (KernelBessel_Order1((double)M_PI*x)/(2.0f*x));
}